

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O0

void __thiscall
google::protobuf::io::ConcatenatingInputStream::BackUp(ConcatenatingInputStream *this,int count)

{
  LogMessage *pLVar1;
  LogMessage local_28;
  Voidify local_15;
  int local_14;
  ConcatenatingInputStream *pCStack_10;
  int count_local;
  ConcatenatingInputStream *this_local;
  
  local_14 = count;
  pCStack_10 = this;
  if (this->stream_count_ < 1) {
    absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
              ((LogMessageDebugFatal *)&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl.cc"
               ,0x137);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_28);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar1,(char (*) [36])"Can\'t BackUp() after failed Next().");
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_15,pLVar1);
    absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
              ((LogMessageDebugFatal *)&local_28);
  }
  else {
    (*(*this->streams_)->_vptr_ZeroCopyInputStream[3])(*this->streams_,(ulong)(uint)count);
  }
  return;
}

Assistant:

void ConcatenatingInputStream::BackUp(int count) {
  if (stream_count_ > 0) {
    streams_[0]->BackUp(count);
  } else {
    ABSL_DLOG(FATAL) << "Can't BackUp() after failed Next().";
  }
}